

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtiming.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Am_Wrapper *pAVar5;
  Am_Method_Wrapper *pAVar6;
  Am_Object *pAVar7;
  void *pvVar8;
  Am_Object *pAVar9;
  Am_Value *this;
  long lVar10;
  uint local_b8;
  int local_b4;
  Am_Time local_b0 [8];
  long local_a8;
  long ms;
  Am_Time stop;
  int local_94;
  Am_Time local_90 [4];
  int i;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Time local_68 [8];
  Am_Time local_60 [8];
  Am_Object local_58;
  Am_Object local_50;
  Am_Object linear;
  Am_Time local_38 [8];
  Am_Object local_30;
  Am_Object local_28;
  Am_Object stepper;
  int size;
  int n;
  char **argv_local;
  int argc_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Test");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (argc < 2) {
    local_b4 = 1000;
  }
  else {
    local_b4 = atoi(argv[1]);
  }
  stepper.data._4_4_ = local_b4;
  if (argc < 3) {
    local_b8 = 0x32;
  }
  else {
    local_b8 = atoi(argv[2]);
  }
  stepper.data._0_4_ = local_b8;
  Am_Initialize();
  Am_Object::Create((char *)&local_30);
  Am_Time::Am_Time(local_38);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_38);
  uVar1 = Am_Object::Set((ushort)&local_30,(Am_Wrapper *)0xe9,(ulong)pAVar5);
  uVar1 = Am_Object::Set(uVar1,0x183,1);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&print_elapsed_time);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::Am_Object(&local_28,pAVar7);
  Am_Time::~Am_Time(local_38);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Create((char *)&local_58);
  Am_Time::Am_Time(local_60);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_60);
  uVar1 = Am_Object::Set((ushort)&local_58,(Am_Wrapper *)0x101,(ulong)pAVar5);
  Am_Time::Am_Time(local_68,10000);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_68);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0xfd,(ulong)pAVar5);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&print_event_count);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::Am_Object(&local_50,pAVar7);
  Am_Time::~Am_Time(local_68);
  Am_Time::~Am_Time(local_60);
  Am_Object::~Am_Object(&local_58);
  poVar4 = std::operator<<((ostream *)&std::cout,"Starting test animation...");
  pvVar8 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar8,std::flush<char,std::char_traits<char>>);
  Am_Object::Create((char *)&local_78);
  uVar1 = Am_Object::Set((ushort)&local_78,0x66,100);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar1,0x67,100);
  Am_Object::Create((char *)&local_88);
  uVar1 = Am_Object::Set((ushort)&local_88,0x66,(ulong)(uint)stepper.data);
  uVar1 = Am_Object::Set(uVar1,0x67,(ulong)(uint)stepper.data);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar1,100,0);
  pAVar9 = (Am_Object *)Am_Object::operator=(&goober,pAVar9);
  Am_Object::Am_Object(&local_80,pAVar9);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(pAVar7,SUB81(&local_80,0),1);
  Am_Object::Am_Object(&local_70,pAVar7);
  Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(&local_70,0),1);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_78);
  Am_Time::Now();
  Am_Time::operator=((Am_Time *)&start,local_90);
  Am_Time::~Am_Time(local_90);
  for (local_94 = 0; local_94 < stepper.data._4_4_; local_94 = local_94 + 1) {
    iVar2 = (int)(uint)stepper.data / 2;
    this = (Am_Value *)Am_Object::Get(0x6238,100);
    iVar3 = Am_Value::operator_cast_to_int(this);
    Am_Object::Set(0x6238,100,(ulong)(uint)(iVar2 - iVar3));
    Am_Demon_Queue::Invoke();
    Am_Update_All();
  }
  Am_Time::Now();
  Am_Time::operator-(local_b0,(Am_Time *)&ms);
  lVar10 = Am_Time::Milliseconds();
  Am_Time::~Am_Time(local_b0);
  local_a8 = lVar10;
  poVar4 = std::operator<<((ostream *)&std::cout,"Redraw executed ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,stepper.data._4_4_);
  poVar4 = std::operator<<(poVar4," steps in ");
  pvVar8 = (void *)std::ostream::operator<<(poVar4,local_a8);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"for average cost of ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(double)local_a8 / (double)stepper.data._4_4_)
  ;
  poVar4 = std::operator<<(poVar4," ms per iteration.");
  pvVar8 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar8,std::flush<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Done.");
  pvVar8 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar8,std::flush<char,std::char_traits<char>>);
  Am_Cleanup();
  Am_Time::~Am_Time((Am_Time *)&ms);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_28);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
  std::cout << "Test" << std::endl;

  int n = argc > 1 ? atoi(argv[1]) : 1000;
  int size = argc > 2 ? atoi(argv[2]) : 50;
  //  bool use_linear = (argc > 2);

  Am_Initialize();

  Am_Object stepper = Am_Stepping_Animator.Create("stepper")
                          .Set(Am_REPEAT_DELAY, Am_Time())
                          .Set(Am_SMALL_INCREMENT, 1)
                          .Set(Am_DO_METHOD, print_elapsed_time);
  Am_Object linear = Am_Animator.Create("linear")
                         .Set(Am_MIN_REPEAT_DELAY, Am_Time())
                         .Set(Am_DURATION, Am_Time(10000))
                         .Set(Am_DO_METHOD, print_event_count);

  std::cout << "Starting test animation..." << std::endl << std::flush;
  Am_Screen.Add_Part(Am_Window.Create()
                         .Set(Am_WIDTH, 100)
                         .Set(Am_HEIGHT, 100)
                         .Add_Part(goober = Am_Rectangle.Create()
                                                .Set(Am_WIDTH, size)
                                                .Set(Am_HEIGHT, size)
                                                .Set(Am_LEFT, 0)));

  start = Am_Time::Now();

  for (int i = 0; i < n; ++i) {
    goober.Set(Am_LEFT, size / 2 - (int)goober.Get(Am_LEFT));
    Main_Demon_Queue.Invoke();
    Am_Update_All();
  }

  Am_Time stop = Am_Time::Now();

  long ms = (stop - start).Milliseconds();

  std::cout << "Redraw executed " << n << " steps in " << ms << std::endl
            << "for average cost of " << double(ms) / n << " ms per iteration."
            << std::endl
            << std::flush;

  std::cout << "Done." << std::endl << std::flush;
  Am_Cleanup();

  return 0;
}